

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManUpdateCopy(Vec_Int_t *vCopy,Gia_Man_t *p)

{
  uint uVar1;
  int Lit;
  int v;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int i;
  
  i = 0;
  do {
    if (vCopy->nSize <= i) {
      return;
    }
    Lit = Vec_IntEntry(vCopy,i);
    if (Lit != -1) {
      v = Abc_Lit2Var(Lit);
      pGVar3 = Gia_ManObj(p,v);
      uVar1 = pGVar3->Value;
      uVar2 = 0xffffffff;
      if (uVar1 != 0xffffffff) {
        uVar2 = Abc_LitIsCompl(Lit);
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar2 = uVar2 ^ uVar1;
      }
      Vec_IntWriteEntry(vCopy,i,uVar2);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Gia_ManUpdateCopy( Vec_Int_t * vCopy, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, iLit;
    Vec_IntForEachEntry( vCopy, iLit, i )
    {
        if ( iLit == -1 )
            continue;
        pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( !~pObj->Value )
            Vec_IntWriteEntry( vCopy, i, -1 );
        else
            Vec_IntWriteEntry( vCopy, i, Abc_LitNotCond(pObj->Value, Abc_LitIsCompl(iLit)) );
    }
}